

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2asc.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s - convert compact CAN frame logfile to ASC logfile.\n",in_RDI);
  fprintf(_stderr,"Usage: %s <options> [can-interfaces]\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -I <infile>   (default stdin)\n");
  fprintf(_stderr,"         -O <outfile>  (default stdout)\n");
  fprintf(_stderr,"         -4  (reduce decimal place to 4 digits)\n");
  fprintf(_stderr,"         -n  (set newline to cr/lf - default lf)\n");
  fprintf(_stderr,"         -f  (use CANFD format also for Classic CAN)\n");
  fprintf(_stderr,"         -r  (suppress dlc for RTR frames - pre v8.5 tools)\n");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "%s - convert compact CAN frame logfile to ASC logfile.\n", prg);
	fprintf(stderr, "Usage: %s <options> [can-interfaces]\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -I <infile>   (default stdin)\n");
	fprintf(stderr, "         -O <outfile>  (default stdout)\n");
	fprintf(stderr, "         -4  (reduce decimal place to 4 digits)\n");
	fprintf(stderr, "         -n  (set newline to cr/lf - default lf)\n");
	fprintf(stderr, "         -f  (use CANFD format also for Classic CAN)\n");
	fprintf(stderr, "         -r  (suppress dlc for RTR frames - pre v8.5 tools)\n");
}